

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O0

ValueLength arangodb::velocypack::readVariableValueLength<true>(uint8_t *source)

{
  byte bVar1;
  ValueLength p;
  uint8_t v;
  ValueLength len;
  uint8_t *source_local;
  
  len = 0;
  p = 0;
  source_local = source;
  do {
    bVar1 = *source_local;
    len = ((ulong)(bVar1 & 0x7f) << ((byte)p & 0x3f)) + len;
    p = p + 7;
    source_local = source_local + -1;
  } while ((bVar1 & 0x80) != 0);
  return len;
}

Assistant:

static inline ValueLength readVariableValueLength(
    uint8_t const* source) noexcept {
  ValueLength len = 0;
  uint8_t v;
  ValueLength p = 0;
  do {
    v = *source;
    len += static_cast<ValueLength>(v & 0x7fU) << p;
    p += 7;
    if (reverse) {
      --source;
    } else {
      ++source;
    }
  } while (v & 0x80U);
  return len;
}